

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HuffmanTree.h
# Opt level: O3

void __thiscall
bwtil::HuffmanTree<unsigned_long>::storeTree
          (HuffmanTree<unsigned_long> *this,vector<bool,_std::allocator<bool>_> *code,Node n,
          vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
          *nodes_vec)

{
  pointer pNVar1;
  pointer pNVar2;
  Node n_00;
  Node n_01;
  undefined8 uVar3;
  ulong uVar4;
  vector<bool,_std::allocator<bool>_> local_148;
  vector<bool,_std::allocator<bool>_> local_120;
  vector<bool,_std::allocator<bool>_> local_f8;
  vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
  local_d0;
  vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
  local_b8;
  vector<bool,_std::allocator<bool>_> local_a0;
  unsigned_long uStack_78;
  ulint uStack_70;
  unsigned_long local_68;
  undefined8 uStack_60;
  unsigned_long uStack_58;
  unsigned_long uStack_50;
  unsigned_long uStack_48;
  ulint uStack_40;
  unsigned_long local_38;
  undefined8 uStack_30;
  unsigned_long uStack_28;
  unsigned_long uStack_20;
  
  std::vector<bool,_std::allocator<bool>_>::vector(&local_a0,code);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_f8,code);
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_a0,false);
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_f8,true);
  if (n.leaf_left == true) {
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((this->codes).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + n.left,&local_a0);
  }
  else {
    std::vector<bool,_std::allocator<bool>_>::vector(&local_120,&local_a0);
    pNVar2 = (nodes_vec->
             super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(nodes_vec->
                   super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 4) *
            -0x5555555555555555;
    if (uVar4 < n.left || uVar4 - n.left == 0) {
      ::std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      goto LAB_0010b84a;
    }
    pNVar1 = pNVar2 + n.left;
    uStack_48 = pNVar1->node_number;
    uStack_40 = pNVar1->freq;
    local_38 = pNVar1->label;
    uStack_30._0_1_ = pNVar1->leaf;
    uStack_30._1_1_ = pNVar1->leaf_left;
    uStack_30._2_1_ = pNVar1->leaf_right;
    uStack_30._3_5_ = *(undefined5 *)&pNVar1->field_0x1b;
    uStack_28 = pNVar2[n.left].left;
    uStack_20 = pNVar2[n.left].right;
    std::
    vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::vector(&local_b8,nodes_vec);
    n_00.freq = uStack_40;
    n_00.node_number = uStack_48;
    n_00.label = local_38;
    n_00.leaf = (bool)(undefined1)uStack_30;
    n_00.leaf_left = (bool)uStack_30._1_1_;
    n_00.leaf_right = (bool)uStack_30._2_1_;
    n_00._27_5_ = uStack_30._3_5_;
    n_00.left = uStack_28;
    n_00.right = uStack_20;
    storeTree(this,&local_120,n_00,&local_b8);
    if (local_b8.
        super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.
                      super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_120.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
  }
  if (n.leaf_right == true) {
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((this->codes).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + n.right,&local_f8);
  }
  else {
    std::vector<bool,_std::allocator<bool>_>::vector(&local_148,&local_f8);
    pNVar2 = (nodes_vec->
             super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(nodes_vec->
                   super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 4) *
            -0x5555555555555555;
    if (uVar4 < n.right || uVar4 - n.right == 0) {
LAB_0010b84a:
      uVar3 = ::std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
      if (local_d0.
          super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.
                        super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
      }
      if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      _Unwind_Resume(uVar3);
    }
    pNVar1 = pNVar2 + n.right;
    uStack_78 = pNVar1->node_number;
    uStack_70 = pNVar1->freq;
    local_68 = pNVar1->label;
    uStack_60._0_1_ = pNVar1->leaf;
    uStack_60._1_1_ = pNVar1->leaf_left;
    uStack_60._2_1_ = pNVar1->leaf_right;
    uStack_60._3_5_ = *(undefined5 *)&pNVar1->field_0x1b;
    uStack_58 = pNVar2[n.right].left;
    uStack_50 = pNVar2[n.right].right;
    std::
    vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::vector(&local_d0,nodes_vec);
    n_01.freq = uStack_70;
    n_01.node_number = uStack_78;
    n_01.label = local_68;
    n_01.leaf = (bool)(undefined1)uStack_60;
    n_01.leaf_left = (bool)uStack_60._1_1_;
    n_01.leaf_right = (bool)uStack_60._2_1_;
    n_01._27_5_ = uStack_60._3_5_;
    n_01.left = uStack_58;
    n_01.right = uStack_50;
    storeTree(this,&local_148,n_01,&local_d0);
    if (local_d0.
        super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0.
                      super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_148.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
  }
  if (local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_f8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void storeTree(vector<bool> code, Node n,vector<Node> nodes_vec){

		vector<bool> codel = code;
		vector<bool> coder = code;

		codel.push_back(0);
		coder.push_back(1);

		//T node_nr = n.node_number;

		if(n.leaf_left){//leaf

			codes[n.left] = codel;
			//left_leafs.at(node_nr) = true;
			//left[node_nr] = n.left;

		}else{

			//left_leafs.at(node_nr) = false;
			//left[node_nr] = n.left;

			storeTree(codel,nodes_vec.at(n.left), nodes_vec);

		}

		if(n.leaf_right){//leaf

			codes[n.right] = coder;
			//right_leafs.at(node_nr) = true;
			//right[node_nr] = n.right;

		}else{

			//right_leafs.at(node_nr) = false;
			//right[node_nr] = n.right;

			storeTree(coder,nodes_vec.at(n.right), nodes_vec);

		}

	}